

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O2

void __thiscall SQLiteTestFixture::teardown(SQLiteTestFixture *this)

{
  string *this_00;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [16];
  undefined1 *local_80;
  char *local_78;
  const_string local_40;
  const_string local_30;
  const_string local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"drop table TEST_TABLE;",&local_b1);
  cpp_db::statement::statement
            ((statement *)local_90,&local_b0,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_90);
  cpp_db::statement::~statement((statement *)local_90);
  this_00 = &local_b0;
  std::__cxx11::string::~string((string *)this_00);
  local_20.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_20.m_end = "";
  local_30.m_begin = "";
  local_30.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_20,0x23,&local_30);
  local_b0._M_dataplus._M_p._0_1_ = 1;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_00191388;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = 
  "no exceptions thrown by cpp_db::statement(\"drop table TEST_TABLE;\", *con).execute_non_query()";
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_40.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_b0,(lazy_ostream *)local_90,&local_40,0x23,CHECK,CHECK_MSG,0
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_b0.field_2._M_allocated_capacity);
  return;
}

Assistant:

void teardown()
    {
        BOOST_CHECK_NO_THROW(cpp_db::statement("drop table TEST_TABLE;", *con).execute_non_query());
    }